

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

void __thiscall Runtime::~Runtime(Runtime *this)

{
  VarEnv *this_00;
  forward_list<VarEnv_*,_std::allocator<VarEnv_*>_> *__range1;
  _Fwd_list_impl _Var1;
  
  _Var1._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)this;
  while (_Var1._M_head._M_next = *(_Fwd_list_node_base *)_Var1._M_head._M_next,
        (_Fwd_list_base<VarEnv_*,_std::allocator<VarEnv_*>_>)_Var1._M_head._M_next !=
        (_Fwd_list_node_base)0x0) {
    this_00 = *(VarEnv **)((long)_Var1._M_head._M_next + 8);
    if (this_00 != (VarEnv *)0x0) {
      VarEnv::~VarEnv(this_00);
      operator_delete(this_00);
    }
  }
  std::_Fwd_list_base<VarEnv_*,_std::allocator<VarEnv_*>_>::~_Fwd_list_base
            ((_Fwd_list_base<VarEnv_*,_std::allocator<VarEnv_*>_> *)this);
  return;
}

Assistant:

Runtime::~Runtime() {
    for (auto &i: varEnvs) {
        if (i != NULL) {
            delete i;
        }
    }
}